

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int Catch::Main(Config *configWrapper)

{
  What WVar1;
  int iVar2;
  int iVar3;
  Runner2 runner;
  Totals local_280;
  Runner2 local_260;
  
  Runner2::Runner2(&local_260,configWrapper);
  WVar1 = (configWrapper->m_data).listSpec;
  if (WVar1 == None) {
    Runner2::runTests(&local_280,&local_260);
    iVar3 = (int)local_280.assertions.failed;
  }
  else {
    List(&configWrapper->m_data);
    cleanUp();
    iVar3 = 0;
  }
  Runner2::~Runner2(&local_260);
  iVar2 = 0;
  if (WVar1 == None) {
    cleanUp();
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

inline int Main( Config& configWrapper ) {
        int result = 0;
        try
        {
            Runner2 runner( configWrapper );

            const ConfigData& config = configWrapper.data();

            // Handle list request
            if( config.listSpec != List::None ) {
                List( config );
                Catch::cleanUp();
                return 0;
            }

            result = static_cast<int>( runner.runTests().assertions.failed );

        }
        catch( std::exception& ex ) {
            std::cerr << ex.what() << std::endl;
            result = (std::numeric_limits<int>::max)();
        }

        Catch::cleanUp();
        return result;
    }